

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void more(void)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  if (skip_more != '\0') {
    return;
  }
  draw_msgwin();
  bVar7 = settings.standout != '\0';
  if ((msgwin == (WINDOW *)0x0) || (msgwin->_maxy != 0)) {
    if (msglines[curline][0] != '\0') {
      wVar2 = curline + L'\x01';
      bVar1 = curline < L'\'';
      curline = L'\0';
      if (bVar1) {
        curline = wVar2;
      }
      msglines[curline][0] = '\0';
    }
    draw_msgwin();
    iVar5 = -2;
    iVar6 = -2;
    if (msgwin != (WINDOW *)0x0) {
      iVar6 = (int)msgwin->_maxy;
    }
    wmove(msgwin,iVar6,0);
    wclrtoeol(msgwin);
    if (msgwin != (WINDOW *)0x0) {
      iVar5 = (int)msgwin->_maxy;
    }
    uVar4 = 0x24;
  }
  else {
    iVar5 = 0;
    uVar4 = 0x48;
  }
  wmove(msgwin,iVar5,uVar4);
  wattr_on(msgwin,(ulong)bVar7 << 0x10,0);
  iVar5 = -1;
  waddnstr(msgwin,"--More--",0xffffffff);
  wattr_off(msgwin,(ulong)bVar7 << 0x10,0);
  wrefresh(msgwin);
  iVar6 = -1;
  if (msgwin != (WINDOW *)0x0) {
    iVar5 = (int)msgwin->_cury;
    iVar6 = (int)msgwin->_curx;
  }
  do {
    do {
      wVar2 = nh_wgetch(msgwin);
      draw_map(player.x,player.y);
      wmove(msgwin,iVar5,iVar6);
      doupdate();
    } while (0x20 < (uint)wVar2);
  } while ((0x108002400U >> ((ulong)(uint)wVar2 & 0x3f) & 1) == 0);
  if (msgwin == (WINDOW *)0x0) {
    iVar5 = -2;
  }
  else {
    iVar5 = (int)msgwin->_maxy;
    if (iVar5 == 0) {
      if (msglines[curline][0] != '\0') {
        wVar3 = curline + L'\x01';
        bVar7 = curline < L'\'';
        curline = L'\0';
        if (bVar7) {
          curline = wVar3;
        }
        msglines[curline][0] = '\0';
      }
      goto LAB_0010ef8f;
    }
  }
  wmove(msgwin,iVar5,0);
  wclrtoeol(msgwin);
LAB_0010ef8f:
  draw_msgwin();
  if (wVar2 == L'\x1b') {
    skip_more = '\x01';
  }
  last_redraw_curline = curline;
  return;
}

Assistant:

static void more(void)
{
    int key;
    int cursx, cursy;
    attr_t attr = A_NORMAL;

    if (skip_more)
	return;

    draw_msgwin();

    if (settings.standout)
	attr = A_STANDOUT;

    if (getmaxy(msgwin) == 1) {
	wmove(msgwin, getmaxy(msgwin)-1, COLNO-8);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    } else {
	newline();
	draw_msgwin();
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
	wmove(msgwin, getmaxy(msgwin)-1, COLNO/2 - 4);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    }

    getyx(msgwin, cursy, cursx);
    do {
	key = nh_wgetch(msgwin);
	draw_map(player.x, player.y);
	wmove(msgwin, cursy, cursx);
	doupdate();
    } while (key != '\n' && key != '\r' && key != ' ' && key != KEY_ESC);

    /* Clean up after the --More--. */
    if (getmaxy(msgwin) == 1) {
	newline();
    } else {
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
    }
    draw_msgwin();

    if (key == KEY_ESC)
	skip_more = TRUE;

    /* we want to --more-- by screenfuls, not lines */
    last_redraw_curline = curline;
}